

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_kfold_int64arith(jit_State *J)

{
  TRef TVar1;
  uint64_t u64;
  cTValue *tv;
  
  u64 = kfold_int64arith(*(uint64_t *)(ulong)(J->fold).left.field_1.op12,
                         *(uint64_t *)(ulong)(J->fold).right.field_1.op12,
                         (uint)(J->fold).ins.field_1.o);
  tv = lj_ir_k64_find(J,u64);
  TVar1 = lj_ir_k64(J,IR_KINT64,tv);
  return TVar1;
}

Assistant:

static uint64_t kfold_int64arith(uint64_t k1, uint64_t k2, IROp op)
{
  switch (op) {
#if LJ_64 || LJ_HASFFI
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
#endif
#if LJ_HASFFI
  case IR_MUL: k1 *= k2; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
#endif
  default: UNUSED(k2); lua_assert(0); break;
  }
  return k1;
}